

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall leveldb::Arena::~Arena(Arena *this)

{
  size_type sVar1;
  reference ppcVar2;
  ulong local_18;
  size_t i;
  Arena *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<char_*,_std::allocator<char_*>_>::size(&this->blocks_);
    if (sVar1 <= local_18) break;
    ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&this->blocks_,local_18);
    if (*ppcVar2 != (value_type)0x0) {
      operator_delete__(*ppcVar2);
    }
    local_18 = local_18 + 1;
  }
  std::vector<char_*,_std::allocator<char_*>_>::~vector(&this->blocks_);
  return;
}

Assistant:

Arena::~Arena() {
  for (size_t i = 0; i < blocks_.size(); i++) {
    delete[] blocks_[i];
  }
}